

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseFuncModuleField(WastParser *this,Module *module)

{
  BindingHash *bindings;
  ModuleField *pMVar1;
  ModuleFieldMixin<(wabt::ModuleFieldType)0> *pMVar2;
  _func_int ***ppp_Var3;
  bool bVar4;
  Result RVar5;
  FuncModuleField *import;
  Enum EVar6;
  long *plVar7;
  long lVar8;
  string_view name_00;
  string_view name_01;
  string name;
  TypeVector local_types;
  ModuleFieldList export_fields;
  Location loc;
  string local_128;
  _Head_base<0UL,_wabt::FuncModuleField_*,_false> local_108;
  __uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_100;
  undefined1 local_f8 [32];
  undefined1 *local_d8;
  undefined1 local_c8 [16];
  long *local_b8 [2];
  long local_a8 [2];
  anon_union_16_2_ecfd7102_for_Location_1 *local_98;
  pointer pTStack_90;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_88;
  long lStack_80;
  ModuleFieldList local_78;
  anon_union_16_2_ecfd7102_for_Location_1 *local_58;
  pointer pTStack_50;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_48;
  long lStack_40;
  
  RVar5 = Expect(this,Lpar);
  if (RVar5.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)local_f8,this);
  local_48.offset = local_f8._16_8_;
  lStack_40 = local_f8._24_8_;
  local_58 = (anon_union_16_2_ecfd7102_for_Location_1 *)local_f8._0_8_;
  pTStack_50 = (pointer)local_f8._8_8_;
  RVar5 = Expect(this,First_RefKind);
  if (RVar5.enum_ == Error) {
    return (Result)Error;
  }
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_128._M_string_length = 0;
  local_128.field_2._M_local_buf[0] = '\0';
  ParseBindVarOpt(this,&local_128);
  local_78.size_ = 0;
  local_78.first_ = (ModuleField *)0x0;
  local_78.last_ = (ModuleField *)0x0;
  RVar5 = ParseInlineExports(this,&local_78,First);
  EVar6 = Error;
  if (RVar5.enum_ == Error) goto LAB_00139bc9;
  bVar4 = PeekMatchLpar(this,Import);
  if (bVar4) {
    CheckImportOrdering(this,module);
    import = (FuncModuleField *)operator_new(0x1e8);
    (((string *)
     &(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField.
      super_intrusive_list_base<wabt::ModuleField>)->_M_dataplus)._M_p =
         (pointer)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField.loc;
    ((string *)
    &(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField.
     super_intrusive_list_base<wabt::ModuleField>)->_M_string_length = 0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField.loc)->
    _M_local_buf[0] = '\0';
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField.loc)->
          _M_local_buf + 0x10) =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField.type_;
    pMVar2 = &import->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>;
    *(char *)((long)&(pMVar2->super_ModuleField).loc.field_1 + 8) = '\0';
    *(char *)((long)&(pMVar2->super_ModuleField).loc.field_1 + 9) = '\0';
    *(char *)((long)&(pMVar2->super_ModuleField).loc.field_1 + 10) = '\0';
    *(char *)((long)&(pMVar2->super_ModuleField).loc.field_1 + 0xb) = '\0';
    *(char *)((long)&(pMVar2->super_ModuleField).loc.field_1 + 0xc) = '\0';
    *(char *)((long)&(pMVar2->super_ModuleField).loc.field_1 + 0xd) = '\0';
    *(char *)((long)&(pMVar2->super_ModuleField).loc.field_1 + 0xe) = '\0';
    *(char *)((long)&(pMVar2->super_ModuleField).loc.field_1 + 0xf) = '\0';
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField.type_)->
    _M_local_buf[0] = '\0';
    *(undefined4 *)&(import->func).name._M_string_length = 0;
    (import->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField._vptr_ModuleField =
         (_func_int **)&PTR__FuncImport_0019d508;
    name_00._M_str = local_128._M_dataplus._M_p;
    name_00._M_len = local_128._M_string_length;
    Func::Func((Func *)&(import->func).name.field_2,name_00);
    RVar5 = ParseInlineImport(this,(Import *)import);
    if (((RVar5.enum_ != Error) &&
        (RVar5 = ParseTypeUseOpt(this,(FuncDeclaration *)
                                      &(import->func).decl.type_var.loc.filename._M_str),
        RVar5.enum_ != Error)) &&
       (RVar5 = ParseFuncSignature(this,(FuncSignature *)
                                        &(import->func).decl.sig.param_types.
                                         super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (BindingHash *)
                                   &(import->func).bindings.
                                    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                                    ._M_h._M_before_begin), RVar5.enum_ != Error)) {
      local_f8._0_8_ = local_f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"type","");
      local_d8 = local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"param","");
      plVar7 = local_a8;
      local_b8[0] = plVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"result","");
      local_98 = (anon_union_16_2_ecfd7102_for_Location_1 *)0x0;
      pTStack_90 = (pointer)0x0;
      local_88.offset = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
                 local_f8,&local_98);
      RVar5 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_98,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_98);
      lVar8 = -0x60;
      do {
        if (plVar7 != (long *)plVar7[-2]) {
          operator_delete((long *)plVar7[-2],*plVar7 + 1);
        }
        plVar7 = plVar7 + -4;
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0);
      if (RVar5.enum_ != Error) {
        GetToken((Token *)local_f8,this);
        local_88.offset = local_f8._16_8_;
        lStack_80 = local_f8._24_8_;
        local_98 = (anon_union_16_2_ecfd7102_for_Location_1 *)local_f8._0_8_;
        pTStack_90 = (pointer)local_f8._8_8_;
        local_100._M_t.
        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
             (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
             operator_new(0x48);
        *(long *)((long)local_100._M_t.
                        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 8) =
             0;
        *(long *)((long)local_100._M_t.
                        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x10
                 ) = 0;
        *(undefined ***)
         local_100._M_t.
         super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
         .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
             &PTR__ModuleField_0019cbf8;
        *(anon_union_16_2_ecfd7102_for_Location_1 **)
         ((long)local_100._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x18) =
             local_98;
        *(pointer *)
         ((long)local_100._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x20) =
             pTStack_90;
        *(size_t *)
         ((long)local_100._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x28) =
             local_88.offset;
        *(long *)((long)local_100._M_t.
                        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x30
                 ) = lStack_80;
        *(undefined4 *)
         ((long)local_100._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x38) = 2;
        *(undefined ***)
         local_100._M_t.
         super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
         .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
             &PTR__ImportModuleField_0019d418;
        *(FuncModuleField **)
         ((long)local_100._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x40) =
             import;
        Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                    *)&local_100);
        if ((_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
             )local_100._M_t.
              super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
              .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl !=
            (ImportModuleField *)0x0) {
          (**(code **)(*(long *)local_100._M_t.
                                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                _M_head_impl + 8))();
        }
        local_100._M_t.
        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
             (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
             (_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
              )0x0;
LAB_00139c56:
        anon_unknown_1::AppendInlineExportFields
                  (module,&local_78,
                   (int)((ulong)((long)(module->funcs).
                                       super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(module->funcs).
                                      super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
        RVar5 = Expect(this,Rpar);
        EVar6 = (Enum)(RVar5.enum_ == Error);
        goto LAB_00139bc9;
      }
    }
  }
  else {
    import = (FuncModuleField *)operator_new(0x1d8);
    (((string *)
     &(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField.
      super_intrusive_list_base<wabt::ModuleField>)->_M_dataplus)._M_p = (pointer)0x0;
    ((string *)
    &(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField.
     super_intrusive_list_base<wabt::ModuleField>)->_M_string_length = 0;
    (import->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField._vptr_ModuleField =
         (_func_int **)&PTR__ModuleField_0019cbf8;
    *(size_t *)
     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField.loc)->
      _M_local_buf + 0x10) = local_48.offset;
    *(long *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField.loc)
              ->_M_local_buf + 0x18) = lStack_40;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField.loc)->
    _M_allocated_capacity = (size_type)local_58;
    *(pointer *)
     ((long)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField.loc + 8) =
         pTStack_50;
    *(undefined4 *)
     &(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField.type_ = 0;
    (import->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField._vptr_ModuleField =
         (_func_int **)&PTR__FuncModuleField_0019d558;
    name_01._M_str = local_128._M_dataplus._M_p;
    name_01._M_len = local_128._M_string_length;
    Func::Func(&import->func,name_01);
    GetToken((Token *)local_f8,this);
    (import->func).loc.field_1.field_1.offset = local_f8._16_8_;
    *(undefined8 *)((long)&(import->func).loc.field_1 + 8) = local_f8._24_8_;
    (import->func).loc.filename._M_len = local_f8._0_8_;
    (import->func).loc.filename._M_str = (char *)local_f8._8_8_;
    RVar5 = ParseTypeUseOpt(this,&(import->func).decl);
    if (RVar5.enum_ != Error) {
      bindings = &(import->func).bindings;
      RVar5 = ParseFuncSignature(this,&(import->func).decl.sig,bindings);
      if (RVar5.enum_ != Error) {
        local_f8._0_8_ = (anon_union_16_2_ecfd7102_for_Location_1 *)0x0;
        local_f8._8_8_ = (pointer)0x0;
        local_f8._16_8_ = 0;
        RVar5 = ParseBoundValueTypeList
                          (this,Local,(TypeVector *)local_f8,bindings,
                           &(import->func).decl.sig.param_type_names,
                           (Index)((ulong)((long)(import->func).decl.sig.param_types.
                                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(import->func).decl.sig.param_types.
                                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 3));
        if (RVar5.enum_ != Error) {
          LocalTypes::Set(&(import->func).local_types,(TypeVector *)local_f8);
          RVar5 = ParseTerminatingInstrList(this,&(import->func).exprs);
          if (RVar5.enum_ != Error) {
            local_108._M_head_impl = import;
            Module::AppendField(module,(unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                                        *)&local_108);
            if (local_108._M_head_impl != (FuncModuleField *)0x0) {
              (*((local_108._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).
                super_ModuleField._vptr_ModuleField[1])();
            }
            local_108._M_head_impl = (FuncModuleField *)0x0;
            if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_f8._0_8_ !=
                (anon_union_16_2_ecfd7102_for_Location_1 *)0x0) {
              operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
            }
            goto LAB_00139c56;
          }
        }
        if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_f8._0_8_ !=
            (anon_union_16_2_ecfd7102_for_Location_1 *)0x0) {
          operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
        }
      }
    }
  }
  (*(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField._vptr_ModuleField
    [1])(import);
LAB_00139bc9:
  pMVar1 = local_78.first_;
  while (pMVar1 != (ModuleField *)0x0) {
    ppp_Var3 = &pMVar1->_vptr_ModuleField;
    pMVar1 = (pMVar1->super_intrusive_list_base<wabt::ModuleField>).next_;
    (*(*ppp_Var3)[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,
                    CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                             local_128.field_2._M_local_buf[0]) + 1);
  }
  return (Result)EVar6;
}

Assistant:

Result WastParser::ParseFuncModuleField(Module* module) {
  WABT_TRACE(ParseFuncModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Func);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Func));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = std::make_unique<FuncImport>(name);
    Func& func = import->func;
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseTypeUseOpt(&func.decl));
    CHECK_RESULT(ParseFuncSignature(&func.decl.sig, &func.bindings));
    CHECK_RESULT(ErrorIfLpar({"type", "param", "result"}));
    auto field =
        std::make_unique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = std::make_unique<FuncModuleField>(loc, name);
    Func& func = field->func;
    func.loc = GetLocation();
    CHECK_RESULT(ParseTypeUseOpt(&func.decl));
    CHECK_RESULT(ParseFuncSignature(&func.decl.sig, &func.bindings));
    TypeVector local_types;
    CHECK_RESULT(ParseBoundValueTypeList(
        TokenType::Local, &local_types, &func.bindings,
        &func.decl.sig.param_type_names, func.GetNumParams()));
    func.local_types.Set(local_types);
    CHECK_RESULT(ParseTerminatingInstrList(&func.exprs));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->funcs.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}